

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O0

void __thiscall PrettyPrinter::visit(PrettyPrinter *this,FnDecl *node)

{
  bool bVar1;
  pointer pIVar2;
  pointer this_00;
  pointer pBVar3;
  __normal_iterator<const_std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_*,_std::vector<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>_>
  local_38;
  __normal_iterator<const_std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_*,_std::vector<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>_>
  local_30;
  __normal_iterator<const_std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_*,_std::vector<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>_>
  local_28;
  __normal_iterator<const_std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_*,_std::vector<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>_>
  local_20;
  const_iterator iter;
  FnDecl *node_local;
  PrettyPrinter *this_local;
  
  iter._M_current = (unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_> *)node;
  std::operator<<((ostream *)&std::cout,"define ");
  pIVar2 = std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>::operator->
                     (iter._M_current + 1);
  (*(pIVar2->super_Expr).super_Stmt._vptr_Stmt[2])(pIVar2,this);
  std::operator<<((ostream *)&std::cout," with params ");
  local_20._M_current =
       (unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_> *)
       std::
       vector<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
       ::cbegin((vector<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
                 *)(iter._M_current + 2));
  while( true ) {
    local_28._M_current =
         (unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_> *)
         std::
         vector<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
         ::cend((vector<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
                 *)(iter._M_current + 2));
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_*,_std::vector<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>_>
              ::operator->(&local_20);
    pIVar2 = std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>::get(this_00);
    (*(pIVar2->super_Expr).super_Stmt._vptr_Stmt[2])(pIVar2,this);
    local_30 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_*,_std::vector<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>_>
               ::operator+(&local_20,1);
    local_38._M_current =
         (unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_> *)
         std::
         vector<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
         ::cend((vector<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
                 *)(iter._M_current + 2));
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
    if (bVar1) {
      std::operator<<((ostream *)&std::cout," ");
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_*,_std::vector<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>_>
    ::operator++(&local_20);
  }
  std::operator<<((ostream *)&std::cout," and body ");
  pBVar3 = std::unique_ptr<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_>::operator->
                     ((unique_ptr<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_> *)
                      (iter._M_current + 5));
  (*(pBVar3->super_Stmt)._vptr_Stmt[2])(pBVar3,this);
  return;
}

Assistant:

void PrettyPrinter::visit(AST::FnDecl *node) {
    std::cout << "define ";
    node->m_ident->accept(this);
    std::cout << " with params ";
    for (auto iter = node->m_params.cbegin(); iter != node->m_params.cend(); ++iter) {
        iter->get()->accept(this);
        if (iter + 1 != node->m_params.cend()) {
            std::cout << " ";
        }
    }
    std::cout << " and body ";
    node->m_body->accept(this);
    // no need to end, block statement will
}